

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

char * Wlc_PrsReadConstant(Wlc_Prs_t *p,char *pStr,Vec_Int_t *vFanins,int *pRange,int *pSigned,
                          int *pXValue)

{
  ulong *puVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint *__ptr;
  int *piVar8;
  ulong uVar9;
  char *pcVar10;
  byte *pbVar11;
  char cVar12;
  byte bVar13;
  char cVar14;
  ulong uVar15;
  int iVar16;
  char *pcVar17;
  byte *pbVar18;
  bool bVar19;
  
  uVar6 = atoi(pStr);
  *pRange = -1;
  *pSigned = 0;
  *pXValue = 0;
  do {
    pcVar17 = pStr;
    cVar14 = *pcVar17;
    pStr = pcVar17 + 1;
  } while (cVar14 == ' ');
  if (cVar14 != '\0') {
    bVar3 = true;
    cVar12 = cVar14;
    do {
      if ((bool)(bVar3 & cVar12 == '\'')) {
        if (cVar14 != '\'') {
          bVar3 = true;
          do {
            bVar19 = cVar14 != '\\';
            bVar5 = cVar14 == ' ';
            if (!bVar19) {
              bVar5 = bVar19;
            }
            if (bVar3) {
              bVar5 = bVar19;
            }
            cVar14 = pcVar17[1];
            pcVar17 = pcVar17 + 1;
            bVar3 = bVar5;
          } while (cVar14 != '\'' || (bool)(~bVar5 & 1));
        }
        cVar14 = pcVar17[1];
        if (cVar14 == 's') {
          *pSigned = 1;
          cVar14 = pcVar17[2];
          pcVar17 = pcVar17 + 1;
        }
        if (cVar14 != 'h') {
          if (cVar14 != 'b') {
            pcVar10 = "Expecting hexadecimal constant and not \"%c\".";
LAB_00379ce3:
            Wlc_PrsWriteErrorMessage(p,pcVar17,pcVar10,(ulong)(uint)(int)cVar14);
            return (char *)0x0;
          }
          uVar7 = (((int)uVar6 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0);
          if (vFanins->nCap < (int)uVar7) {
            if (vFanins->pArray == (int *)0x0) {
              piVar8 = (int *)malloc((long)(int)uVar7 << 2);
            }
            else {
              piVar8 = (int *)realloc(vFanins->pArray,(long)(int)uVar7 << 2);
            }
            vFanins->pArray = piVar8;
            if (piVar8 == (int *)0x0) goto LAB_00379ee1;
            vFanins->nCap = uVar7;
          }
          if (0 < (int)uVar7) {
            memset(vFanins->pArray,0,(ulong)uVar7 << 2);
          }
          vFanins->nSize = uVar7;
          if (0 < (int)uVar6) {
            uVar9 = 0;
            uVar7 = uVar6;
            do {
              uVar7 = uVar7 - 1;
              cVar14 = pcVar17[uVar9 + 2];
              if (cVar14 != '0') {
                if (cVar14 != '1') {
                  pcVar10 = "Wrong digit in binary constant \"%c\".";
                  goto LAB_00379ce3;
                }
                vFanins->pArray[(int)uVar7 >> 5] =
                     vFanins->pArray[(int)uVar7 >> 5] | 1 << ((byte)uVar7 & 0x1f);
              }
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
          }
          *pRange = uVar6;
          return pcVar17 + (long)(int)uVar6 + 2;
        }
        *pXValue = (uint)((pcVar17[2] & 0xdfU) == 0x58);
        uVar7 = (((int)uVar6 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0);
        if ((int)uVar7 <= vFanins->nCap) {
LAB_00379dac:
          pbVar18 = (byte *)(pcVar17 + 2);
          piVar8 = vFanins->pArray;
          if (0 < (int)uVar7) {
            memset(piVar8,0,(ulong)uVar7 << 2);
          }
          vFanins->nSize = uVar7;
          if ((0xf5 < (byte)(*pbVar18 - 0x3a)) || (0xf9 < (byte)((*pbVar18 & 0xdf) + 0xb9))) {
            uVar9 = 0;
            do {
              do {
                lVar4 = uVar9 + 3;
                uVar9 = uVar9 + 1;
              } while (0xf5 < (byte)(pcVar17[lVar4] - 0x3aU));
            } while (0xf9 < (byte)((pcVar17[lVar4] & 0xdfU) + 0xb9));
            if ((int)uVar9 != 0) {
              pbVar11 = (byte *)(pcVar17 + (long)(int)uVar9 + 1);
              bVar13 = 0;
              uVar15 = 0;
              do {
                bVar2 = *pbVar11;
                iVar16 = -0x30;
                if (((9 < (byte)(bVar2 - 0x30)) && (iVar16 = -0x37, 5 < (byte)(bVar2 + 0xbf))) &&
                   (iVar16 = -0x57, 5 < (byte)(bVar2 + 0x9f))) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                                ,0x4bf,"int Abc_TtReadHexDigit(char)");
                }
                puVar1 = (ulong *)(piVar8 + (uVar15 >> 4 & 0xfffffff) * 2);
                *puVar1 = *puVar1 | (ulong)(iVar16 + (uint)bVar2) << (bVar13 & 0x3c);
                uVar15 = uVar15 + 1;
                bVar13 = bVar13 + 4;
                pbVar11 = pbVar11 + -1;
              } while ((uVar9 & 0xffffffff) != uVar15);
            }
          }
          *pRange = uVar6;
          do {
            bVar13 = *pbVar18;
            if ((9 < (byte)(bVar13 - 0x30)) && (0x19 < (byte)((bVar13 & 0xdf) + 0xbf))) {
              if (0x3b < bVar13 - 0x24) {
                return (char *)pbVar18;
              }
              if ((0x900000000000001U >> ((ulong)(bVar13 - 0x24) & 0x3f) & 1) == 0) {
                return (char *)pbVar18;
              }
            }
            pbVar18 = pbVar18 + 1;
          } while( true );
        }
        if (vFanins->pArray == (int *)0x0) {
          piVar8 = (int *)malloc((long)(int)uVar7 << 2);
        }
        else {
          piVar8 = (int *)realloc(vFanins->pArray,(long)(int)uVar7 << 2);
        }
        vFanins->pArray = piVar8;
        if (piVar8 != (int *)0x0) {
          vFanins->nCap = uVar7;
          goto LAB_00379dac;
        }
        goto LAB_00379ee1;
      }
      bVar19 = cVar12 != '\\';
      bVar5 = cVar12 == ' ';
      if (!bVar19) {
        bVar5 = bVar19;
      }
      if (bVar3) {
        bVar5 = bVar19;
      }
      bVar3 = bVar5;
      cVar12 = *pStr;
      pStr = pStr + 1;
    } while (cVar12 != '\0');
  }
  uVar7 = atoi(pcVar17);
  uVar6 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar6 = (uVar6 ^ 0xffffffe0) + 0x21;
  if (uVar7 + 1 < 2) {
    uVar6 = uVar7 + 1;
  }
  *pRange = uVar6;
  if (0x1f < (int)uVar6) {
    __assert_fail("*pRange < 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadVer.c"
                  ,0x24e,
                  "char *Wlc_PrsReadConstant(Wlc_Prs_t *, char *, Vec_Int_t *, int *, int *, int *)"
                 );
  }
  pcVar17 = pcVar17 + -1;
  do {
    pcVar10 = pcVar17 + 1;
    pcVar17 = pcVar17 + 1;
  } while (0xf5 < (byte)(*pcVar10 - 0x3aU));
  __ptr = (uint *)vFanins->pArray;
  if (vFanins->nCap < 1) {
    if (__ptr == (uint *)0x0) {
      __ptr = (uint *)malloc(4);
    }
    else {
      __ptr = (uint *)realloc(__ptr,4);
    }
    vFanins->pArray = (int *)__ptr;
    if (__ptr == (uint *)0x0) {
LAB_00379ee1:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vFanins->nCap = 1;
  }
  *__ptr = uVar7;
  vFanins->nSize = 1;
  return pcVar17;
}

Assistant:

static inline char * Wlc_PrsReadConstant( Wlc_Prs_t * p, char * pStr, Vec_Int_t * vFanins, int * pRange, int * pSigned, int * pXValue )
{
    int i, nDigits, nBits = atoi( pStr );
    *pRange = -1;
    *pSigned = 0;
    *pXValue = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( Wlc_PrsFindSymbol( pStr, '\'' ) == NULL )
    {
        // handle decimal number
        int Number = atoi( pStr );
        *pRange = Abc_Base2Log( Number+1 );
        assert( *pRange < 32 );
        while ( Wlc_PrsIsDigit(pStr) )
            pStr++;
        Vec_IntFill( vFanins, 1, Number );
        return pStr;
    }
    pStr = Wlc_PrsFindSymbol( pStr, '\'' );
    if ( pStr[1] == 's' )
    {
        *pSigned = 1;
        pStr++;
    }
    if ( pStr[1] == 'b' )
    {
        Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
        for ( i = 0; i < nBits; i++ )
            if ( pStr[2+i] == '1' )
                Abc_InfoSetBit( (unsigned *)Vec_IntArray(vFanins), nBits-1-i );
            else if ( pStr[2+i] != '0' )
                return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Wrong digit in binary constant \"%c\".", pStr[2+i] );
        *pRange = nBits;
        pStr += 2 + nBits;
        return pStr;
    }
    if ( pStr[1] != 'h' )
        return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Expecting hexadecimal constant and not \"%c\".", pStr[1] );
    *pXValue = (pStr[2] == 'x' || pStr[2] == 'X');
    if ( *pXValue == 'X' )
        *pXValue = 'x';
    Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
    nDigits = Abc_TtReadHexNumber( (word *)Vec_IntArray(vFanins), pStr+2 );
    if ( nDigits != (nBits + 3)/4 )
    {
//        return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "The length of a constant does not match." );
//        printf( "Warning: The length of a constant (%d hex digits) does not match the number of bits (%d).\n", nDigits, nBits );
    }
    *pRange = nBits;
    pStr += 2;
    while ( Wlc_PrsIsChar(pStr) )
        pStr++;
    return pStr;
}